

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  memset(this,0,0x98);
  this->CurrFrameVisible = -1;
  this->PrevFrameVisible = -1;
  this->LastTabItemIdx = -1;
  return;
}

Assistant:

ImGuiTabBar::ImGuiTabBar()
{
    memset(this, 0, sizeof(*this));
    CurrFrameVisible = PrevFrameVisible = -1;
    LastTabItemIdx = -1;
}